

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.c
# Opt level: O1

_Bool upb_Message_IsEqual(upb_Message *msg1,upb_Message *msg2,upb_MiniTable *m,int options)

{
  byte bVar1;
  undefined4 uVar2;
  upb_MiniTableField *puVar3;
  upb_Map *arr2;
  undefined8 map;
  undefined8 map_00;
  _Bool _Var4;
  _Bool _Var5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  upb_UnknownCompareResult uVar10;
  undefined7 extraout_var;
  size_t sVar11;
  ulong uVar12;
  upb_Extension *puVar13;
  size_t sVar14;
  uint uVar15;
  upb_MiniTable *puVar16;
  upb_CType uVar17;
  ulong uVar18;
  upb_MiniTableExtension *unaff_RBX;
  byte unaff_BPL;
  ulong *puVar19;
  ulong uVar20;
  uint *puVar21;
  upb_MessageValue key;
  upb_MessageValue val1;
  upb_MiniTableField *f2;
  upb_MiniTableField *f1;
  size_t iter2;
  size_t iter1;
  upb_MessageValue val2;
  upb_MessageValue val1_1;
  upb_MiniTable *local_d8;
  upb_Map *local_c8;
  upb_Map *local_c0;
  size_t local_b0;
  size_t local_a8;
  upb_MessageValue local_a0;
  upb_MessageValue local_90;
  upb_MessageValue local_80;
  upb_MiniTableField *local_70;
  upb_MiniTableField *local_68;
  size_t local_60 [2];
  upb_MessageValue local_50;
  upb_MessageValue local_40;
  
  _Var4 = true;
  if (msg1 != msg2) {
    local_60[1] = 0xffffffffffffffff;
    local_60[0] = 0xffffffffffffffff;
    do {
      _Var4 = _upb_Message_NextBaseField_dont_copy_me__upb_internal_use_only
                        (msg1,m,&local_68,&local_80,local_60 + 1);
      uVar18 = CONCAT71(extraout_var,_Var4) & 0xffffffff;
      _Var4 = _upb_Message_NextBaseField_dont_copy_me__upb_internal_use_only
                        (msg2,m,&local_70,&local_90,local_60);
      map_00 = local_80.double_val;
      map = local_90.double_val;
      bVar7 = (byte)uVar18;
      if ((bVar7 & _Var4) == 1) {
        if (local_68 == local_70) {
          bVar7 = local_68->descriptortype_dont_copy_me__upb_internal_use_only;
          bVar8 = local_68->mode_dont_copy_me__upb_internal_use_only;
          uVar15 = (uint)bVar7;
          if ((bVar8 & 0x10) == 0) {
            if ((ulong)(uVar15 - 1) - 9 < 2) {
              puVar16 = *m->subs_dont_copy_me__upb_internal_use_only
                         [local_68->submsg_index_dont_copy_me__upb_internal_use_only].
                         submsg_dont_copy_me__upb_internal_use_only;
            }
            else {
LAB_00302c03:
              puVar16 = (upb_MiniTable *)0x0;
            }
          }
          else {
            if (bVar7 == 5) goto LAB_00302c03;
            puVar16 = (upb_MiniTable *)0x0;
            if (uVar15 != 0xc) goto LAB_00303196;
          }
          if ((bVar8 & 0x10) == 0) {
            uVar18 = (ulong)(uVar15 - 1);
LAB_00302c4c:
            uVar17 = *(upb_CType *)(upb_FieldType_CType_c_type + uVar18 * 4);
            switch(bVar8 & 3) {
            case 0:
switchD_00302c67_caseD_0:
              if (local_80.int64_val == local_90.int64_val) {
LAB_00302d6d:
                unaff_BPL = 1;
              }
              else {
                local_c8 = local_90.map_val;
                local_c0 = local_80.map_val;
                if (local_80._0_8_ == (upb_Map *)0x0) {
                  sVar14 = 0;
                }
                else {
                  sVar14 = upb_Map_Size(local_80.map_val);
                }
                if ((upb_Map *)map == (upb_Map *)0x0) {
                  sVar11 = 0;
                }
                else {
                  sVar11 = upb_Map_Size((upb_Map *)map);
                }
                if (sVar14 == sVar11) {
                  if (puVar16->field_count_dont_copy_me__upb_internal_use_only != 2) {
                    __assert_fail("upb_MiniTable_FieldCount(m) == 2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                                  ,0xa5,
                                  "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                                 );
                  }
                  puVar3 = puVar16->fields_dont_copy_me__upb_internal_use_only;
                  if (puVar3[1].number_dont_copy_me__upb_internal_use_only != 2) {
                    __assert_fail("upb_MiniTableField_Number(f) == 2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                                  ,0xa7,
                                  "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                                 );
                  }
                  bVar7 = puVar3[1].descriptortype_dont_copy_me__upb_internal_use_only;
                  uVar15 = (uint)bVar7;
                  if ((puVar3[1].mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
                    if ((ulong)(uVar15 - 1) - 9 < 2) {
                      local_d8 = *puVar16->subs_dont_copy_me__upb_internal_use_only
                                  [puVar3[1].submsg_index_dont_copy_me__upb_internal_use_only].
                                  submsg_dont_copy_me__upb_internal_use_only;
                    }
                    else {
LAB_00302d95:
                      local_d8 = (upb_MiniTable *)0x0;
                    }
                  }
                  else {
                    if (bVar7 == 5) goto LAB_00302d95;
                    local_d8 = (upb_MiniTable *)0x0;
                    if (uVar15 != 0xc) goto LAB_00303196;
                  }
                  if ((puVar3[1].mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
                    uVar18 = (ulong)(uVar15 - 1);
                  }
                  else {
                    uVar18 = 0xd;
                    if (bVar7 != 5) {
                      if (uVar15 != 0xc) goto LAB_00303196;
                      uVar18 = 8;
                    }
                  }
                  uVar2 = *(undefined4 *)(upb_FieldType_CType_c_type + uVar18 * 4);
                  local_a8 = 0xffffffffffffffff;
LAB_00302de1:
                  do {
                    _Var4 = upb_Map_Next((upb_Map *)map_00,&local_a0,&local_40,&local_a8);
                    if ((!_Var4) || (_Var5 = upb_Map_Get((upb_Map *)map,local_a0,&local_50), !_Var5)
                       ) break;
                    switch(uVar2) {
                    case 1:
                      _Var5 = (((uint)local_50.uint64_val ^ (uint)local_40.uint64_val) & 1) == 0;
                      break;
                    case 2:
                    case 3:
                    case 4:
                    case 5:
                      _Var5 = (uint)local_40.uint64_val == (uint)local_50.uint64_val;
                      break;
                    case 6:
                      _Var5 = upb_Message_IsEqual(local_40.msg_val,local_50.msg_val,local_d8,options
                                                 );
                      break;
                    case 7:
                    case 8:
                    case 9:
                      _Var5 = local_40.int64_val == local_50.int64_val;
                      break;
                    case 10:
                    case 0xb:
                      if (local_40.str_val.size != local_50.str_val.size) goto LAB_00302ea1;
                      if (local_40.str_val.size == 0) goto LAB_00302de1;
                      iVar9 = bcmp(local_40.array_val,local_50.array_val,local_40.str_val.size);
                      _Var5 = iVar9 == 0;
                      break;
                    default:
                      goto switchD_003030c4_default;
                    }
                  } while (_Var5 != false);
LAB_00302ea1:
                  unaff_BPL = ~_Var4 & 1;
                }
                else {
LAB_00302d75:
                  unaff_BPL = 0;
                }
              }
              break;
            case 1:
switchD_00302c67_caseD_1:
              unaff_BPL = _upb_Array_IsEqual(local_80.array_val,local_90.array_val,uVar17,puVar16,
                                             options);
              break;
            case 2:
switchD_00302c67_caseD_2:
              switch(uVar17) {
              case kUpb_CType_Bool:
                unaff_BPL = (((uint)local_90.uint64_val ^ (uint)local_80.uint64_val) & 1) == 0;
                break;
              case kUpb_CType_Float:
              case kUpb_CType_Int32:
              case kUpb_CType_UInt32:
              case kUpb_CType_Enum:
                unaff_BPL = (uint)local_80.uint64_val == (uint)local_90.uint64_val;
                break;
              case kUpb_CType_Message:
                unaff_BPL = upb_Message_IsEqual(local_80.msg_val,local_90.msg_val,puVar16,options);
                break;
              case kUpb_CType_Double:
              case kUpb_CType_Int64:
              case kUpb_CType_UInt64:
                unaff_BPL = local_80.int64_val == local_90.int64_val;
                break;
              case kUpb_CType_String:
              case kUpb_CType_Bytes:
                if (local_80.str_val.size != local_90.str_val.size) goto LAB_00302d75;
                if (local_80.str_val.size == 0) goto LAB_00302d6d;
                iVar9 = bcmp(local_80.array_val,local_90.array_val,local_80.str_val.size);
                unaff_BPL = iVar9 == 0;
                break;
              default:
                goto switchD_003030c4_default;
              }
            }
          }
          else {
            uVar18 = 0xd;
            if (bVar7 == 5) goto LAB_00302c4c;
            if (uVar15 != 0xc) goto LAB_00303196;
            uVar17 = 10;
            switch(bVar8 & 3) {
            case 0:
              goto switchD_00302c67_caseD_0;
            case 1:
              goto switchD_00302c67_caseD_1;
            case 2:
              goto switchD_00302c67_caseD_2;
            }
          }
          unaff_RBX = (upb_MiniTableExtension *)
                      CONCAT71((int7)((ulong)unaff_RBX >> 8),(byte)unaff_RBX & unaff_BPL);
          bVar7 = unaff_BPL;
        }
        else {
          unaff_RBX = (upb_MiniTableExtension *)0x0;
          bVar7 = 0;
        }
      }
      else {
        unaff_RBX = (upb_MiniTableExtension *)(CONCAT71((int7)(uVar18 >> 8),bVar7 ^ _Var4) ^ 1);
        bVar7 = 0;
      }
    } while ((bVar7 & 1) != 0);
    if (((ulong)unaff_RBX & 1) != 0) {
      uVar18 = 0;
      local_b0 = 0;
      do {
        puVar21 = (uint *)((msg1->field_0).internal_opaque & 0xfffffffffffffffe);
        if ((puVar21 == (uint *)0x0) || (uVar20 = uVar18, *puVar21 <= uVar18)) {
          bVar6 = false;
        }
        else {
          do {
            uVar20 = uVar20 + 1;
            bVar6 = false;
            if ((*(ulong *)(puVar21 + uVar20 * 2) & 1) != 0) {
              puVar19 = (ulong *)(*(ulong *)(puVar21 + uVar20 * 2) & 0xfffffffffffffffc);
              switch(*(byte *)(*puVar19 + 0xb) & 3) {
              case 0:
                uVar12 = puVar19[1];
                if (*(char *)(uVar12 + 3) == '\x01') {
                  uVar12 = (ulong)*(uint *)(uVar12 + 0x10);
                }
                else {
                  uVar12 = upb_inttable_count((upb_inttable *)(uVar12 + 8));
                }
                break;
              case 1:
                uVar12 = *(ulong *)(puVar19[1] + 8);
                break;
              case 2:
                goto switchD_00302f3f_caseD_2;
              case 3:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/extension.h"
                              ,0x3f,
                              "_Bool _upb_Extension_IsEmpty_dont_copy_me__upb_internal_use_only(const upb_Extension *)"
                             );
              }
              if (uVar12 == 0) {
                bVar6 = false;
              }
              else {
switchD_00302f3f_caseD_2:
                unaff_RBX = (upb_MiniTableExtension *)*puVar19;
                local_c8 = (upb_Map *)puVar19[1];
                local_c0 = (upb_Map *)puVar19[2];
                bVar6 = true;
                uVar18 = uVar20;
              }
            }
            if (bVar6) {
              bVar6 = true;
              goto LAB_00302fc0;
            }
          } while (uVar20 < *puVar21);
          bVar6 = false;
          uVar18 = uVar20;
        }
LAB_00302fc0:
        if (!bVar6) {
          sVar14 = upb_Message_ExtensionCount(msg2);
          if (local_b0 == sVar14) {
            if ((options & 1U) == 0) {
              return true;
            }
            uVar10 = _upb_Message_UnknownFieldsAreEqual_dont_copy_me__upb_internal_use_only
                               (msg1,msg2,100);
            return uVar10 == kUpb_UnknownCompareResult_Equal;
          }
          break;
        }
        puVar13 = _upb_Message_Getext_dont_copy_me__upb_internal_use_only(msg2,unaff_RBX);
        if (puVar13 == (upb_Extension *)0x0) {
          bVar8 = 0;
        }
        else {
          arr2 = (upb_Map *)(puVar13->data).array_val;
          bVar8 = (unaff_RBX->field_dont_copy_me__upb_internal_use_only).
                  descriptortype_dont_copy_me__upb_internal_use_only;
          if ((bVar8 & 0xfe) == 10) {
            if (((unaff_RBX->field_dont_copy_me__upb_internal_use_only).
                 mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
              if (1 < (ulong)(bVar8 - 1 & 0xb) - 9) goto LAB_00303029;
              puVar16 = (unaff_RBX->sub_dont_copy_me__upb_internal_use_only).
                        submsg_dont_copy_me__upb_internal_use_only;
            }
            else {
              if (bVar8 == 5) goto LAB_00303029;
              puVar16 = (upb_MiniTable *)0x0;
              if (bVar8 != 0xc) {
LAB_00303196:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                              ,0x7b,
                              "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)"
                             );
              }
            }
          }
          else {
LAB_00303029:
            puVar16 = (upb_MiniTable *)0x0;
          }
          bVar1 = (unaff_RBX->field_dont_copy_me__upb_internal_use_only).
                  mode_dont_copy_me__upb_internal_use_only;
          if ((bVar1 & 0x10) == 0) {
            uVar20 = (ulong)(bVar8 - 1);
LAB_0030307c:
            uVar17 = *(upb_CType *)(upb_FieldType_CType_c_type + uVar20 * 4);
            switch(bVar1 & 3) {
            case 0:
switchD_00303098_caseD_0:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/compare.c"
                            ,0xa2,
                            "_Bool _upb_Message_ExtensionsAreEqual(const upb_Message *, const upb_Message *, const upb_MiniTable *, int)"
                           );
            case 1:
switchD_00303098_caseD_1:
              bVar7 = _upb_Array_IsEqual((upb_Array *)local_c8,(upb_Array *)arr2,uVar17,puVar16,
                                         options);
              break;
            case 2:
switchD_00303098_caseD_2:
              switch(uVar17) {
              case kUpb_CType_Bool:
                bVar7 = (((uint)arr2 ^ (uint)local_c8) & 1) == 0;
                break;
              case kUpb_CType_Float:
              case kUpb_CType_Int32:
              case kUpb_CType_UInt32:
              case kUpb_CType_Enum:
                bVar7 = (uint)local_c8 == (uint)arr2;
                break;
              case kUpb_CType_Message:
                bVar7 = upb_Message_IsEqual((upb_Message *)local_c8,(upb_Message *)arr2,puVar16,
                                            options);
                break;
              case kUpb_CType_Double:
              case kUpb_CType_Int64:
              case kUpb_CType_UInt64:
                bVar7 = local_c8 == arr2;
                break;
              case kUpb_CType_String:
              case kUpb_CType_Bytes:
                if (local_c0 == (upb_Map *)(puVar13->data).str_val.size) {
                  if (local_c0 == (upb_Map *)0x0) {
                    bVar7 = 1;
                  }
                  else {
                    iVar9 = bcmp(local_c8,arr2,(size_t)local_c0);
                    bVar7 = iVar9 == 0;
                  }
                }
                else {
                  bVar7 = 0;
                }
                break;
              default:
switchD_003030c4_default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/compare.h"
                              ,0x46,
                              "_Bool upb_MessageValue_IsEqual(upb_MessageValue, upb_MessageValue, upb_CType, const upb_MiniTable *, int)"
                             );
              }
            }
          }
          else {
            uVar20 = 0xd;
            if (bVar8 == 5) goto LAB_0030307c;
            if (bVar8 != 0xc) goto LAB_00303196;
            uVar17 = 10;
            switch(bVar1 & 3) {
            case 0:
              goto switchD_00303098_caseD_0;
            case 1:
              goto switchD_00303098_caseD_1;
            case 2:
              goto switchD_00303098_caseD_2;
            }
          }
          local_b0 = local_b0 + 1;
          bVar8 = bVar7;
        }
      } while ((bVar8 & 1) != 0);
    }
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool upb_Message_IsEqual(const upb_Message* msg1, const upb_Message* msg2,
                         const upb_MiniTable* m, int options) {
  if (UPB_UNLIKELY(msg1 == msg2)) return true;

  if (!_upb_Message_BaseFieldsAreEqual(msg1, msg2, m, options)) return false;
  if (!_upb_Message_ExtensionsAreEqual(msg1, msg2, m, options)) return false;

  if (!(options & kUpb_CompareOption_IncludeUnknownFields)) return true;

  // The wire encoder enforces a maximum depth of 100 so we match that here.
  return UPB_PRIVATE(_upb_Message_UnknownFieldsAreEqual)(msg1, msg2, 100) ==
         kUpb_UnknownCompareResult_Equal;
}